

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
               (cmExecutionStatus *status,bool source_file_directory_option_enabled,
               bool source_file_target_option_enabled,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_directories,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_target_directories,
               vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *source_file_directory_makefiles)

{
  bool bVar1;
  
  bVar1 = HandleSourceFileDirectoryScopeValidation
                    (status,source_file_directory_option_enabled,source_file_target_option_enabled,
                     source_file_directories,source_file_target_directories);
  if (bVar1) {
    bVar1 = HandleSourceFileDirectoryScopes
                      (status,source_file_directories,source_file_target_directories,
                       source_file_directory_makefiles);
    return bVar1;
  }
  return false;
}

Assistant:

bool HandleAndValidateSourceFileDirectoryScopes(
  cmExecutionStatus& status, bool source_file_directory_option_enabled,
  bool source_file_target_option_enabled,
  std::vector<std::string>& source_file_directories,
  std::vector<std::string>& source_file_target_directories,
  std::vector<cmMakefile*>& source_file_directory_makefiles)
{
  bool scope_options_valid =
    SetPropertyCommand::HandleSourceFileDirectoryScopeValidation(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories);
  if (!scope_options_valid) {
    return false;
  }

  scope_options_valid = SetPropertyCommand::HandleSourceFileDirectoryScopes(
    status, source_file_directories, source_file_target_directories,
    source_file_directory_makefiles);
  return scope_options_valid;
}